

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O1

void InternalSphere::Statistics
               (dgSphere *sphere,dgVector *eigenValues,dgVector *scaleVector,HaF32 *vertex,
               HaI32 *faceIndex,HaI32 indexCount,HaI32 stride)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  dgMatrix *initialGuess;
  uint uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  float fVar43;
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  
  bVar14 = false;
  bVar15 = indexCount == 0;
  auVar22 = in_ZMM21._0_16_;
  auVar23 = in_ZMM18._0_16_;
  auVar21 = in_ZMM20._0_16_;
  auVar20 = in_ZMM17._0_16_;
  auVar19 = in_ZMM19._0_16_;
  auVar16 = in_ZMM16._0_16_;
  if (indexCount < 1) {
    vxorpd_avx512vl(auVar22,auVar22);
    auVar22 = vxorps_avx512vl(auVar23,auVar23);
    auVar23 = ZEXT816(0);
    auVar21 = vxorps_avx512vl(auVar21,auVar21);
    auVar20 = vxorps_avx512vl(auVar20,auVar20);
    auVar19 = vxorps_avx512vl(auVar19,auVar19);
    auVar16 = vxorps_avx512vl(auVar16,auVar16);
  }
  else {
    auVar16 = vxorps_avx512vl(auVar16,auVar16);
    auVar17 = vxorpd_avx512vl(auVar22,auVar22);
    lVar13 = 0;
    lVar12 = (long)stride;
    auVar18 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
    auVar19 = vxorps_avx512vl(auVar19,auVar19);
    auVar20 = vxorps_avx512vl(auVar20,auVar20);
    auVar21 = vxorps_avx512vl(auVar21,auVar21);
    auVar42 = ZEXT864(0);
    auVar22 = vxorps_avx512vl(auVar23,auVar23);
    do {
      lVar10 = faceIndex[lVar13] * lVar12;
      fVar35 = (float)vertex[lVar10 + 1];
      fVar36 = (float)vertex[lVar10 + 2];
      if ((((0x7f7fffff < (uint)ABS((float)vertex[lVar10])) || (0x7f7fffff < (uint)ABS(fVar35))) ||
          (NAN(fVar35))) || ((0x7f7fffff < (uint)ABS(fVar36) || (NAN(fVar36))))) {
LAB_00877811:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x127,"dgVector::dgVector(const hacd::HaF32 *)");
      }
      fVar38 = (scaleVector->super_dgTemplateVector<float>).m_x;
      fVar43 = (scaleVector->super_dgTemplateVector<float>).m_y;
      fVar8 = (float)vertex[lVar10] * fVar38;
      fVar35 = fVar35 * fVar43;
      fVar45 = (scaleVector->super_dgTemplateVector<float>).m_z;
      fVar36 = fVar36 * fVar45;
      fVar1 = (scaleVector->super_dgTemplateVector<float>).m_w;
      if (((0x7f7fffff < (uint)ABS(fVar8)) ||
          ((0x7f7fffff < (uint)ABS(fVar35) || (0x7f7fffff < (uint)ABS(fVar36))))) ||
         (0x7f7fffff < (uint)ABS(fVar1))) goto LAB_008777f2;
      lVar10 = faceIndex[lVar13 + 1] * lVar12;
      fVar2 = (float)vertex[lVar10 + 1];
      fVar3 = (float)vertex[lVar10 + 2];
      if ((((0x7f7fffff < (uint)ABS((float)vertex[lVar10])) || (0x7f7fffff < (uint)ABS(fVar2))) ||
          (NAN(fVar2))) || ((0x7f7fffff < (uint)ABS(fVar3) || (NAN(fVar3))))) goto LAB_00877811;
      fVar9 = fVar38 * (float)vertex[lVar10];
      auVar23 = vmulss_avx512f(ZEXT416((uint)fVar43),ZEXT416((uint)fVar2));
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar45),ZEXT416((uint)fVar3));
      if ((0x7f7fffff < (uint)ABS(fVar9)) ||
         ((0x7f7fffff < (auVar23._0_4_ & 0x7fffffff) || (0x7f7fffff < (auVar24._0_4_ & 0x7fffffff)))
         )) goto LAB_008777f2;
      lVar10 = faceIndex[lVar13 + 2] * lVar12;
      fVar2 = (float)vertex[lVar10 + 1];
      fVar3 = (float)vertex[lVar10 + 2];
      if (((0x7f7fffff < (uint)ABS((float)vertex[lVar10])) ||
          (((0x7f7fffff < (uint)ABS(fVar2) || (NAN(fVar2))) || (0x7f7fffff < (uint)ABS(fVar3))))) ||
         (NAN(fVar3))) goto LAB_00877811;
      auVar25 = vmulss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)vertex[lVar10]));
      auVar26 = vmulss_avx512f(ZEXT416((uint)fVar43),ZEXT416((uint)fVar2));
      auVar27 = vmulss_avx512f(ZEXT416((uint)fVar45),ZEXT416((uint)fVar3));
      if (((0x7f7fffff < (auVar25._0_4_ & 0x7fffffff)) ||
          (0x7f7fffff < (auVar26._0_4_ & 0x7fffffff))) ||
         (0x7f7fffff < (auVar27._0_4_ & 0x7fffffff))) goto LAB_008777f2;
      auVar28 = vsubss_avx512f(auVar23,ZEXT416((uint)fVar35));
      auVar29 = vsubss_avx512f(auVar24,ZEXT416((uint)fVar36));
      auVar30 = vsubss_avx512f(auVar25,ZEXT416((uint)fVar8));
      auVar31 = vsubss_avx512f(auVar26,ZEXT416((uint)fVar35));
      auVar32 = vsubss_avx512f(auVar27,ZEXT416((uint)fVar36));
      auVar33 = vfmsub231ss_fma(ZEXT416((uint)(auVar31._0_4_ * auVar29._0_4_)),auVar28,auVar32);
      auVar29 = vfmsub231ss_fma(ZEXT416((uint)(auVar32._0_4_ * (fVar9 - fVar8))),auVar30,auVar29);
      fVar38 = auVar29._0_4_;
      auVar29 = vfmsub231ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar28._0_4_)),
                                ZEXT416((uint)(fVar9 - fVar8)),auVar31);
      if (((0x7f7fffff < (auVar33._0_4_ & 0x7fffffff)) || (0x7f7fffff < (uint)ABS(fVar38))) ||
         (0x7f7fffff < (auVar29._0_4_ & 0x7fffffff))) goto LAB_008777f2;
      auVar33 = vfmadd213ss_fma(auVar33,auVar33,ZEXT416((uint)(fVar38 * fVar38)));
      vfmadd213ss_fma(auVar29,auVar29,auVar33);
      auVar33 = vucomiss_avx512f(auVar18);
      auVar33 = vsqrtss_avx(auVar33,auVar33);
      auVar33 = vmulss_avx512f(auVar33,ZEXT416(0x3f000000));
      auVar29 = vaddss_avx512f(ZEXT416((uint)fVar35),auVar23);
      auVar28 = vaddss_avx512f(ZEXT416((uint)fVar36),auVar24);
      auVar30 = vaddss_avx512f(ZEXT416((uint)(fVar8 + fVar9)),auVar25);
      auVar29 = vaddss_avx512f(auVar29,auVar26);
      auVar28 = vaddss_avx512f(auVar28,auVar27);
      if (((0x7f7fffff < (auVar30._0_4_ & 0x7fffffff)) ||
          (0x7f7fffff < (auVar29._0_4_ & 0x7fffffff))) ||
         (0x7f7fffff < (auVar28._0_4_ & 0x7fffffff))) goto LAB_008777f2;
      auVar31 = ZEXT416(0x3eaaaaab);
      auVar30 = vmulss_avx512f(auVar30,auVar31);
      fVar38 = auVar30._0_4_;
      auVar29 = vmulss_avx512f(auVar29,auVar31);
      fVar43 = auVar29._0_4_;
      auVar28 = vmulss_avx512f(auVar28,auVar31);
      fVar45 = auVar28._0_4_;
      if (((0x7f7fffff < (uint)ABS(fVar38)) || (0x7f7fffff < (uint)ABS(fVar43))) ||
         ((uint)ABS(fVar45) >= 0x7f800000)) goto LAB_008777f2;
      auVar37._0_8_ = (double)auVar33._0_4_;
      auVar37._8_8_ = auVar33._8_8_;
      auVar39 = ZEXT416((uint)fVar8);
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar39,auVar39);
      auVar34 = vfmadd231ss_avx512f(auVar33,auVar25,auVar25);
      auVar33 = vmulss_avx512f(auVar23,auVar23);
      auVar41 = ZEXT416((uint)fVar35);
      auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar35),auVar41);
      auVar31 = vfmadd231ss_avx512f(auVar33,auVar26,auVar26);
      auVar33 = vmulss_avx512f(auVar24,auVar24);
      auVar40 = ZEXT416((uint)fVar36);
      auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar36),auVar40);
      auVar32 = vfmadd231ss_avx512f(auVar33,auVar27,auVar27);
      auVar33 = vmulss_avx512f(ZEXT416((uint)fVar9),auVar23);
      auVar33 = vfmadd231ss_fma(auVar33,auVar39,auVar41);
      auVar33 = vfmadd231ss_avx512f(auVar33,auVar25,auVar26);
      auVar23 = vmulss_avx512f(auVar23,auVar24);
      auVar23 = vfmadd231ss_fma(auVar23,auVar40,auVar41);
      auVar26 = vfmadd231ss_avx512f(auVar23,auVar27,auVar26);
      auVar23 = vmulss_avx512f(ZEXT416((uint)fVar9),auVar24);
      auVar23 = vfmadd231ss_fma(auVar23,auVar39,auVar40);
      auVar24 = vfmadd231ss_avx512f(auVar23,auVar25,auVar27);
      auVar23 = vucomiss_avx512f(ZEXT416(0x38d1b717));
      if ((uint)ABS(fVar45) < 0x7f800000) {
        auVar25 = vinsertps_avx(auVar28,ZEXT416((uint)fVar1),0x10);
        auVar23 = vinsertps_avx(auVar30,auVar29,0x10);
      }
      else {
        fVar35 = auVar23._0_4_;
        if (((0x7f7fffff < (uint)ABS(fVar38 * fVar35)) || (0x7f7fffff < (uint)ABS(fVar43 * fVar35)))
           || (0x7f7fffff < (uint)ABS(fVar45 * fVar35))) goto LAB_008777f2;
        auVar25 = vinsertps_avx(ZEXT416((uint)(fVar45 * fVar35)),ZEXT416((uint)fVar1),0x10);
        auVar23 = vinsertps_avx(ZEXT416((uint)(fVar38 * fVar35)),ZEXT416((uint)(fVar43 * fVar35)),
                                0x10);
        dVar47 = auVar37._0_8_ / 12.0;
        auVar44._0_8_ = (double)fVar43;
        auVar44._8_8_ = auVar29._8_8_;
        auVar46._0_8_ = (double)fVar45;
        auVar46._8_8_ = auVar28._8_8_;
        auVar40._0_8_ = (double)auVar26._0_4_;
        auVar40._8_8_ = auVar26._8_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auVar44._0_8_ * 9.0;
        auVar26 = vfmadd231sd_fma(auVar40,auVar48,auVar46);
        dVar4 = dVar47 * auVar26._0_8_;
        auVar41._0_8_ = (double)fVar38;
        auVar41._8_8_ = auVar30._8_8_;
        auVar39._0_8_ = (double)auVar24._0_4_;
        auVar39._8_8_ = auVar24._8_8_;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auVar41._0_8_ * 9.0;
        auVar24 = vfmadd231sd_fma(auVar39,auVar49,auVar46);
        auVar30._0_8_ = (double)auVar33._0_4_;
        auVar30._8_8_ = auVar33._8_8_;
        auVar26 = vfmadd231sd_fma(auVar30,auVar49,auVar44);
        dVar5 = dVar47 * auVar26._0_8_;
        auVar28._0_8_ = (double)auVar32._0_4_;
        auVar28._8_8_ = auVar32._8_8_;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = auVar46._0_8_ * 9.0;
        auVar26 = vfmadd231sd_fma(auVar28,auVar46,auVar50);
        dVar6 = dVar47 * auVar26._0_8_;
        auVar29._0_8_ = (double)auVar31._0_4_;
        auVar29._8_8_ = auVar31._8_8_;
        auVar26 = vfmadd231sd_fma(auVar29,auVar48,auVar44);
        auVar27._0_8_ = (double)auVar34._0_4_;
        auVar27._8_8_ = auVar34._8_8_;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = auVar41._0_8_ * 9.0;
        auVar27 = vfmadd231sd_fma(auVar27,auVar31,auVar41);
        dVar7 = dVar47 * auVar27._0_8_;
        auVar34._0_4_ = (float)dVar7;
        auVar34._4_4_ = (int)((ulong)dVar7 >> 0x20);
        auVar34._8_8_ = 0;
        auVar31 = ZEXT416((uint)(float)(dVar47 * auVar26._0_8_));
        auVar32._0_4_ = (float)dVar6;
        auVar32._4_4_ = (int)((ulong)dVar6 >> 0x20);
        auVar32._8_8_ = 0;
        auVar33._0_4_ = (float)dVar5;
        auVar33._4_4_ = (int)((ulong)dVar5 >> 0x20);
        auVar33._8_8_ = 0;
        auVar24 = ZEXT416((uint)(float)(dVar47 * auVar24._0_8_));
        auVar26._0_4_ = (float)dVar4;
        auVar26._4_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar26._8_8_ = 0;
      }
      fVar35 = auVar31._0_4_;
      if ((((NAN(auVar32._0_4_)) || (0x7f7fffff < (uint)ABS(auVar32._0_4_))) || (NAN(fVar35))) ||
         ((0x7f7fffff < (uint)ABS(fVar35) || (0x7f7fffff < (auVar34._0_4_ & 0x7fffffff)))))
      goto LAB_00877830;
      fVar36 = auVar24._0_4_;
      if (((NAN(auVar26._0_4_)) || ((0x7f7fffff < (uint)ABS(auVar26._0_4_) || (NAN(fVar36))))) ||
         ((0x7f7fffff < (uint)ABS(fVar36) || (0x7f7fffff < (auVar33._0_4_ & 0x7fffffff)))))
      goto LAB_00877830;
      auVar17 = vaddsd_avx512f(auVar17,auVar37);
      auVar22 = vaddps_avx512vl(auVar22,auVar23);
      auVar23._0_4_ = auVar42._0_4_ + auVar25._0_4_;
      auVar23._4_4_ = auVar42._4_4_ + auVar25._4_4_;
      auVar23._8_4_ = auVar42._8_4_ + auVar25._8_4_;
      auVar23._12_4_ = auVar42._12_4_ + auVar25._12_4_;
      auVar23 = vblendps_avx(auVar23,auVar42._0_16_,2);
      auVar42 = ZEXT1664(auVar23);
      auVar16 = vaddss_avx512f(auVar16,auVar32);
      auVar24 = vaddss_avx512f(auVar19,auVar34);
      auVar19 = vmovshdup_avx512vl(auVar19);
      auVar19 = vinsertps_avx512f(auVar24,ZEXT416((uint)(auVar19._0_4_ + fVar35)),0x10);
      auVar24 = vaddss_avx512f(auVar21,auVar33);
      auVar21 = vmovshdup_avx512vl(auVar21);
      auVar21 = vinsertps_avx512f(auVar24,ZEXT416((uint)(auVar21._0_4_ + fVar36)),0x10);
      auVar20 = vaddss_avx512f(auVar20,auVar26);
      lVar13 = lVar13 + 3;
      uVar11 = (uint)lVar13;
      bVar14 = uVar11 < (uint)indexCount;
      bVar15 = uVar11 == indexCount;
    } while ((int)uVar11 < indexCount);
  }
  auVar18 = vucomisd_avx512f(ZEXT816(0x3f1a36e2e0000000));
  if (!bVar14 && !bVar15) {
    auVar18 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar18);
    auVar17._0_4_ = (float)auVar18._0_8_;
    auVar17._4_12_ = auVar18._4_12_;
    auVar18 = vmulss_avx512f(auVar19,auVar17);
    auVar19 = vmovshdup_avx512vl(auVar19);
    fVar35 = auVar19._0_4_ * auVar17._0_4_;
    auVar19 = vmulss_avx512f(auVar16,auVar17);
    uVar11 = vextractps_avx512f(auVar16,1);
    if (((((auVar18._0_4_ & 0x7fffffff) < 0x7f800000) && ((uint)ABS(fVar35) < 0x7f800000)) &&
        ((auVar19._0_4_ & 0x7fffffff) < 0x7f800000)) && ((uVar11 & 0x7fffffff) < 0x7f800000)) {
      auVar24 = vmulss_avx512f(auVar21,auVar17);
      auVar19 = vmovshdup_avx512vl(auVar21);
      fVar36 = auVar19._0_4_ * auVar17._0_4_;
      auVar21 = vmulss_avx512f(auVar20,auVar17);
      uVar11 = vextractps_avx512f(auVar20,1);
      if ((((auVar24._0_4_ & 0x7fffffff) < 0x7f800000) && ((uint)ABS(fVar36) < 0x7f800000)) &&
         (((auVar21._0_4_ & 0x7fffffff) < 0x7f800000 && ((uVar11 & 0x7fffffff) < 0x7f800000)))) {
        auVar25 = vmulss_avx512f(auVar22,auVar17);
        auVar19 = vmovshdup_avx512vl(auVar22);
        fVar38 = auVar19._0_4_ * auVar17._0_4_;
        uVar11 = vextractps_avx(auVar23,1);
        if ((((auVar25._0_4_ & 0x7fffffff) < 0x7f800000) && ((uint)ABS(fVar38) < 0x7f800000)) &&
           (((uint)ABS(auVar23._0_4_ * auVar17._0_4_) < 0x7f800000 &&
            ((uVar11 & 0x7fffffff) < 0x7f800000)))) {
          auVar19 = vinsertps_avx512f(auVar18,ZEXT416((uint)fVar35),0x10);
          auVar16 = vmulss_avx512f(auVar16,auVar17);
          auVar20._0_4_ = auVar21._0_4_;
          auVar21 = vinsertps_avx512f(auVar24,ZEXT416((uint)fVar36),0x10);
          auVar22 = vinsertps_avx512f(auVar25,ZEXT416((uint)fVar38),0x10);
          auVar23 = ZEXT416((uint)(auVar23._0_4_ * auVar17._0_4_));
          goto LAB_008776a3;
        }
      }
    }
LAB_008777f2:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
  }
LAB_008776a3:
  auVar18 = vfnmadd213ss_avx512f(auVar22,auVar22,auVar19);
  auVar17 = vmovshdup_avx512vl(auVar22);
  auVar24 = vfnmadd213ss_avx512f(auVar17,auVar22,auVar21);
  fVar36 = auVar24._0_4_;
  auVar21 = vmovshdup_avx512vl(auVar21);
  auVar21 = vfnmadd231ss_avx512f(auVar21,auVar23,auVar22);
  fVar35 = auVar21._0_4_;
  if ((((!NAN(fVar35)) && ((uint)ABS(fVar35) < 0x7f800000)) && (!NAN(fVar36))) &&
     (((uint)ABS(fVar36) < 0x7f800000 && ((uint)ABS(auVar18._0_4_) < 0x7f800000)))) {
    auVar19 = vmovshdup_avx512vl(auVar19);
    auVar19 = vfnmadd231ss_fma(auVar19,auVar17,auVar17);
    auVar20 = vfnmadd231ss_avx512f(auVar20,auVar23,auVar17);
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x = auVar18._0_4_;
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar36;
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar35;
    (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = 0.0;
    uVar11 = auVar20._0_4_ & 0x7fffffff;
    auVar20 = vucomiss_avx512f(auVar20);
    if (((POPCOUNT(uVar11 + 0x80800000 & 0xff) & 1U) != 0) &&
       ((uVar11 < 0x7f800000 && ((uint)ABS(auVar19._0_4_) < 0x7f800000)))) {
      auVar16 = vfnmadd213ss_avx512f(auVar23,auVar23,auVar16);
      (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = fVar36;
      (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = auVar19._0_4_;
      (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = auVar20._0_4_;
      (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = 0.0;
      if ((uint)ABS(auVar16._0_4_) < 0x7f800000) {
        (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar35;
        (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = auVar20._0_4_;
        (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = auVar16._0_4_;
        (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = 0.0;
        initialGuess = dgGetIdentityMatrix();
        dgMatrix::EigenVectors(&sphere->super_dgMatrix,eigenValues,initialGuess);
        return;
      }
    }
  }
LAB_00877830:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

static void Statistics (dgSphere &sphere, dgVector &eigenValues, dgVector &scaleVector, const hacd::HaF32 vertex[], const hacd::HaI32 faceIndex[], hacd::HaI32 indexCount, hacd::HaI32 stride)
	{
		dgVector var (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector cov (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector centre (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector massCenter (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));

		hacd::HaF64 totalArea = hacd::HaF32 (0.0f);
		const hacd::HaF32* const ptr = vertex;
		for (hacd::HaI32 i = 0; i < indexCount; i += 3) {
			hacd::HaI32 index = faceIndex[i] * stride;
			dgVector p0 (&ptr[index]);
			p0 = p0.CompProduct (scaleVector);

			index = faceIndex[i + 1] * stride;;
			dgVector p1 (&ptr[index]);
			p1 = p1.CompProduct (scaleVector);

			index = faceIndex[i + 2] * stride;;
			dgVector p2 (&ptr[index]);
			p2 = p2.CompProduct (scaleVector);

			dgVector normal ((p1 - p0) * (p2 - p0));

			hacd::HaF64 area = hacd::HaF32 (0.5f) * sqrt (normal % normal);

			centre = p0 + p1 + p2;
			centre = centre.Scale (hacd::HaF32  (1.0f / 3.0f));

			// Inertia of each point in the triangle
			hacd::HaF64 Ixx = p0.m_x * p0.m_x + p1.m_x * p1.m_x + p2.m_x * p2.m_x;	
			hacd::HaF64 Iyy = p0.m_y * p0.m_y + p1.m_y * p1.m_y + p2.m_y * p2.m_y;	
			hacd::HaF64 Izz = p0.m_z * p0.m_z + p1.m_z * p1.m_z + p2.m_z * p2.m_z;	

			hacd::HaF64 Ixy = p0.m_x * p0.m_y + p1.m_x * p1.m_y + p2.m_x * p2.m_y;	
			hacd::HaF64 Iyz = p0.m_y * p0.m_z + p1.m_y * p1.m_z + p2.m_y * p2.m_z;	
			hacd::HaF64 Ixz = p0.m_x * p0.m_z + p1.m_x * p1.m_z + p2.m_x * p2.m_z;	

			if (area > dgEPSILON * 10.0) {
				hacd::HaF64 K = area / hacd::HaF64 (12.0);
				//Coriolis theorem for Inertia of a triangle in an arbitrary orientation
				Ixx = K * (Ixx + 9.0 * centre.m_x * centre.m_x);
				Iyy = K * (Iyy + 9.0 * centre.m_y * centre.m_y);
				Izz = K * (Izz + 9.0 * centre.m_z * centre.m_z);

				Ixy = K * (Ixy + 9.0 * centre.m_x * centre.m_y);
				Ixz = K * (Ixz + 9.0 * centre.m_x * centre.m_z);
				Iyz = K * (Iyz + 9.0 * centre.m_y * centre.m_z);
				centre = centre.Scale ((hacd::HaF32)area);
			} 

			totalArea += area;
			massCenter += centre;
			var += dgVector ((hacd::HaF32)Ixx, (hacd::HaF32)Iyy, (hacd::HaF32)Izz, hacd::HaF32 (0.0f));
			cov += dgVector ((hacd::HaF32)Ixy, (hacd::HaF32)Ixz, (hacd::HaF32)Iyz, hacd::HaF32 (0.0f));
		}

		if (totalArea > dgEPSILON * 10.0) {
			hacd::HaF64 K = hacd::HaF64 (1.0) / totalArea; 
			var = var.Scale ((hacd::HaF32)K);
			cov = cov.Scale ((hacd::HaF32)K);
			massCenter = massCenter.Scale ((hacd::HaF32)K);
		}

		hacd::HaF64 Ixx = var.m_x - massCenter.m_x * massCenter.m_x;
		hacd::HaF64 Iyy = var.m_y - massCenter.m_y * massCenter.m_y;
		hacd::HaF64 Izz = var.m_z - massCenter.m_z * massCenter.m_z;

		hacd::HaF64 Ixy = cov.m_x - massCenter.m_x * massCenter.m_y;
		hacd::HaF64 Ixz = cov.m_y - massCenter.m_x * massCenter.m_z;
		hacd::HaF64 Iyz = cov.m_z - massCenter.m_y * massCenter.m_z;

		sphere.m_front = dgVector ((hacd::HaF32)Ixx, (hacd::HaF32)Ixy, (hacd::HaF32)Ixz, hacd::HaF32 (0.0f));
		sphere.m_up    = dgVector ((hacd::HaF32)Ixy, (hacd::HaF32)Iyy, (hacd::HaF32)Iyz, hacd::HaF32 (0.0f));
		sphere.m_right = dgVector ((hacd::HaF32)Ixz, (hacd::HaF32)Iyz, (hacd::HaF32)Izz, hacd::HaF32 (0.0f));
		sphere.EigenVectors(eigenValues);
	}